

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  Printer *pPVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FileDescriptor *pFVar6;
  string *psVar7;
  ulong uVar8;
  size_type sVar9;
  reference ppFVar10;
  FieldGenerator *pFVar11;
  reference pvVar12;
  FieldOptions *this_00;
  LogMessage *pLVar13;
  OneofDescriptor *pOVar14;
  int __c;
  uint i_00;
  uint extraout_EDX;
  int __c_00;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar16;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  char *pcVar17;
  Hex hex;
  bool local_449;
  int local_40c;
  string local_3a8;
  string local_388;
  FieldDescriptor *local_368;
  FieldDescriptor *field_3;
  int j_1;
  int i_1;
  LogFinisher local_332;
  byte local_331;
  LogMessage local_330;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [12];
  AlphaNum local_2a0;
  undefined1 local_270 [8];
  string mask;
  int has_bit_index;
  bool have_enclosing_if;
  FieldGenerator *generator_1;
  FieldDescriptor *field_2;
  int j;
  bool deferred_has_bit_changes;
  string local_210;
  uint local_1f0;
  LogFinisher local_1ea;
  byte local_1e9;
  int new_index;
  LogFinisher local_1aa;
  byte local_1a9;
  LogMessage local_1a8;
  bool local_169;
  int local_168;
  LogFinisher local_162;
  bool have_outer_if;
  int count;
  LogFinisher local_122;
  byte local_121;
  LogMessage local_120;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  int local_a8;
  int local_a4;
  int chunk;
  int index;
  FieldDescriptor *field_1;
  uint32 last_chunk_mask;
  int last_chunk_end;
  int last_chunk_start;
  int last_chunk;
  FieldGenerator *generator;
  FieldDescriptor *field;
  byte local_61;
  LogMessage local_60;
  uint32 local_24;
  uint32 local_20;
  int i;
  int last_i;
  int cached_has_bit_index;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  _last_i = printer;
  printer_local = (Printer *)this;
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar2 = HasDescriptorMethods(pFVar6,&this->options_);
  pPVar1 = _last_i;
  if (bVar2) {
    psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n// @@protoc_insertion_point(generalized_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                       ,"classname",&this->classname_,"full_name",psVar7);
    io::Printer::Indent(_last_i);
    pPVar1 = _last_i;
    psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "const $classname$* source =\n    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n        &from);\nif (source == NULL) {\n// @@protoc_insertion_point(generalized_merge_from_cast_fail:$full_name$)\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n// @@protoc_insertion_point(generalized_merge_from_cast_success:$full_name$)\n  MergeFrom(*source);\n}\n"
                       ,"classname",&this->classname_,"full_name",psVar7);
    io::Printer::Outdent(_last_i);
    io::Printer::Print(_last_i,"}\n\n");
  }
  else {
    io::Printer::Print(_last_i,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",&this->classname_);
  }
  pPVar1 = _last_i;
  psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar1,
                     "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                     ,"classname",&this->classname_,"full_name",psVar7);
  io::Printer::Indent(_last_i);
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print(_last_i,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  io::Printer::Print(_last_i,
                     "_internal_metadata_.MergeFrom(from._internal_metadata_);\n::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
                    );
  i = -1;
  local_20 = 0xffffffff;
  local_24 = 0;
  do {
    uVar8 = (ulong)(int)local_24;
    sVar9 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->optimized_order_);
    if (sVar9 <= uVar8) {
      for (field_3._4_4_ = 0; iVar4 = field_3._4_4_,
          iVar5 = Descriptor::oneof_decl_count(this->descriptor_), pPVar1 = _last_i, iVar4 < iVar5;
          field_3._4_4_ = field_3._4_4_ + 1) {
        pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_3._4_4_);
        psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar14);
        io::Printer::Print(pPVar1,"switch (from.$oneofname$_case()) {\n","oneofname",psVar7);
        io::Printer::Indent(_last_i);
        field_3._0_4_ = 0;
        while( true ) {
          iVar4 = (int)field_3;
          pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_3._4_4_);
          iVar5 = OneofDescriptor::field_count(pOVar14);
          pPVar1 = _last_i;
          if (iVar5 <= iVar4) break;
          pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_3._4_4_);
          local_368 = OneofDescriptor::field(pOVar14,(int)field_3);
          pPVar1 = _last_i;
          psVar7 = FieldDescriptor::name_abi_cxx11_(local_368);
          UnderscoresToCamelCase(&local_388,psVar7,true);
          io::Printer::Print(pPVar1,"case k$field_name$: {\n","field_name",&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          io::Printer::Indent(_last_i);
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,local_368);
          (*pFVar11->_vptr_FieldGenerator[0xb])(pFVar11,_last_i);
          io::Printer::Print(_last_i,"break;\n");
          io::Printer::Outdent(_last_i);
          io::Printer::Print(_last_i,"}\n");
          field_3._0_4_ = (int)field_3 + 1;
        }
        pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_3._4_4_);
        psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar14);
        ToUpper(&local_3a8,psVar7);
        io::Printer::Print(pPVar1,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name"
                           ,&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        io::Printer::Outdent(_last_i);
        io::Printer::Print(_last_i,"}\n");
      }
      if (this->num_weak_fields_ != 0) {
        io::Printer::Print(_last_i,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
      }
      io::Printer::Outdent(_last_i);
      io::Printer::Print(_last_i,"}\n");
      return;
    }
    local_61 = 0;
    if (local_24 == local_20) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xbde);
      local_61 = 1;
      pLVar13 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (i) != (last_i): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&field + 3),pLVar13);
    }
    if ((local_61 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_60);
    }
    local_20 = local_24;
    for (; uVar8 = (ulong)(int)local_24,
        sVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&this->optimized_order_), uVar8 < sVar9; local_24 = local_24 + 1) {
      ppFVar10 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::operator[](&this->optimized_order_,(long)(int)local_24);
      generator = (FieldGenerator *)*ppFVar10;
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
      if (!bVar2) break;
      _last_chunk_start =
           FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)generator);
      (*_last_chunk_start->_vptr_FieldGenerator[0xb])(_last_chunk_start,_last_i);
    }
    last_chunk_end = -1;
    last_chunk_mask = 0xffffffff;
    field_1._4_4_ = 0xffffffff;
    field_1._0_4_ = 0;
    for (; uVar8 = (ulong)(int)local_24,
        sVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&this->optimized_order_), uVar8 < sVar9; local_24 = local_24 + 1) {
      pcVar17 = (char *)(long)(int)local_24;
      ppFVar10 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::operator[](&this->optimized_order_,(size_type)pcVar17);
      _chunk = *ppFVar10;
      bVar2 = FieldDescriptor::is_repeated(_chunk);
      if (bVar2) break;
      pFVar6 = Descriptor::file(this->descriptor_);
      bVar2 = HasFieldPresence(pFVar6);
      if (bVar2) {
        pcVar17 = FieldDescriptor::index(_chunk,pcVar17,__c);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->has_bit_indices_,(long)(int)pcVar17);
        local_40c = *pvVar12;
      }
      else {
        local_40c = 0;
      }
      local_a4 = local_40c;
      local_a8 = local_40c / 8;
      if (last_chunk_end == -1) {
        last_chunk_mask = local_24;
        last_chunk_end = local_a8;
      }
      else if (local_a8 != last_chunk_end) break;
      field_1._4_4_ = local_24;
      field_1._0_4_ = 1 << ((byte)((long)local_40c % 0x20) & 0x1f) | (uint)field_1;
    }
    if (last_chunk_end != -1) {
      local_e1 = 0;
      if (last_chunk_mask == 0xffffffff) {
        internal::LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xc0b);
        local_e1 = 1;
        pLVar13 = internal::LogMessage::operator<<
                            (&local_e0,"CHECK failed: (-1) != (last_chunk_start): ");
        internal::LogFinisher::operator=(&local_e2,pLVar13);
      }
      if ((local_e1 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_e0);
      }
      local_121 = 0;
      if (field_1._4_4_ == 0xffffffff) {
        internal::LogMessage::LogMessage
                  (&local_120,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xc0c);
        local_121 = 1;
        pLVar13 = internal::LogMessage::operator<<
                            (&local_120,"CHECK failed: (-1) != (last_chunk_end): ");
        internal::LogFinisher::operator=(&local_122,pLVar13);
      }
      if ((local_121 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_120);
      }
      have_outer_if = false;
      if ((uint)field_1 == 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&count,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xc0d);
        have_outer_if = true;
        pLVar13 = internal::LogMessage::operator<<
                            ((LogMessage *)&count,"CHECK failed: (0) != (last_chunk_mask): ");
        internal::LogFinisher::operator=(&local_162,pLVar13);
      }
      if ((have_outer_if & 1U) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)&count);
      }
      local_168 = popcnt((uint)field_1);
      pFVar6 = Descriptor::file(this->descriptor_);
      bVar2 = HasFieldPresence(pFVar6);
      local_449 = bVar2 && last_chunk_mask != field_1._4_4_;
      local_169 = local_449;
      uVar15 = extraout_RDX;
      if (bVar2 && last_chunk_mask != field_1._4_4_) {
        local_1a9 = 0;
        if (local_168 < 2) {
          internal::LogMessage::LogMessage
                    (&local_1a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc17);
          local_1a9 = 1;
          pLVar13 = internal::LogMessage::operator<<(&local_1a8,"CHECK failed: (2) <= (count): ");
          internal::LogFinisher::operator=(&local_1aa,pLVar13);
        }
        if ((local_1a9 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_1a8);
        }
        local_1e9 = 0;
        if (8 < local_168) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&new_index,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc18);
          local_1e9 = 1;
          pLVar13 = internal::LogMessage::operator<<
                              ((LogMessage *)&new_index,"CHECK failed: (8) >= (count): ");
          internal::LogFinisher::operator=(&local_1ea,pLVar13);
        }
        if ((local_1e9 & 1) != 0) {
          internal::LogMessage::~LogMessage((LogMessage *)&new_index);
        }
        pPVar1 = _last_i;
        i_00 = last_chunk_end % 4;
        if (i != last_chunk_end / 4) {
          iVar4 = last_chunk_end;
          if (last_chunk_end < 0) {
            iVar4 = last_chunk_end + 3;
          }
          local_1f0 = iVar4 >> 2;
          SimpleItoa_abi_cxx11_(&local_210,(protobuf *)(ulong)local_1f0,i_00);
          io::Printer::Print(pPVar1,"cached_has_bits = from._has_bits_[$new_index$];\n","new_index",
                             &local_210);
          std::__cxx11::string::~string((string *)&local_210);
          i = local_1f0;
          i_00 = extraout_EDX;
        }
        pPVar1 = _last_i;
        SimpleItoa_abi_cxx11_((string *)&j,(protobuf *)(ulong)(uint)field_1,i_00);
        io::Printer::Print(pPVar1,"if (cached_has_bits & $mask$u) {\n","mask",(string *)&j);
        std::__cxx11::string::~string((string *)&j);
        io::Printer::Indent(_last_i);
        uVar15 = extraout_RDX_00;
      }
      bVar2 = false;
      for (field_2._0_4_ = last_chunk_mask; iVar4 = (int)uVar15,
          (int)(uint32)field_2 <= (int)field_1._4_4_; field_2._0_4_ = (uint32)field_2 + 1) {
        ppFVar10 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[](&this->optimized_order_,(long)(int)(uint32)field_2);
        field_00 = *ppFVar10;
        pFVar16 = field_00;
        pFVar11 = FieldGeneratorMap::get(&this->field_generators_,field_00);
        mask.field_2._M_local_buf[0xf] = '\0';
        pFVar6 = Descriptor::file(this->descriptor_);
        bVar3 = HasFieldPresence(pFVar6);
        pPVar1 = _last_i;
        if (bVar3) {
          pcVar17 = FieldDescriptor::index(field_00,(char *)pFVar16,__c_00);
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->has_bit_indices_,(long)(int)pcVar17);
          mask.field_2._8_4_ = *pvVar12;
          this_00 = FieldDescriptor::options(field_00);
          bVar3 = FieldOptions::weak(this_00);
          pPVar1 = _last_i;
          pFVar16 = extraout_RDX_01;
          if ((bVar3) ||
             (pFVar16 = (FieldDescriptor *)((long)(int)mask.field_2._8_4_ % 0x20 & 0xffffffff),
             i != (int)mask.field_2._8_4_ / 0x20)) {
            FieldName_abi_cxx11_(&local_2d0,(cpp *)field_00,pFVar16);
            io::Printer::Print(pPVar1,"if (from.has_$name$()) {\n","name",&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
          }
          else {
            strings::Hex::Hex<unsigned_int>
                      ((Hex *)local_2b0,1 << ((byte)mask.field_2._8_4_ & 0x1f),ZERO_PAD_8);
            hex._12_4_ = 0;
            hex.value = local_2b0._0_8_;
            hex.spec = local_2b0._8_4_;
            strings::AlphaNum::AlphaNum(&local_2a0,hex);
            StrCat_abi_cxx11_((string *)local_270,(protobuf *)&local_2a0,a);
            io::Printer::Print(_last_i,"if (cached_has_bits & 0x$mask$u) {\n","mask",
                               (string *)local_270);
            std::__cxx11::string::~string((string *)local_270);
          }
          io::Printer::Indent(_last_i);
          mask.field_2._M_local_buf[0xf] = '\x01';
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2f0,"from.",&local_2f1);
          mask.field_2._M_local_buf[0xf] =
               anon_unknown_0::EmitFieldNonDefaultCondition(pPVar1,&local_2f0,field_00);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        }
        if (((local_169 & 1U) == 0) || (bVar3 = anon_unknown_0::IsPOD(field_00), !bVar3)) {
          (*pFVar11->_vptr_FieldGenerator[0xb])(pFVar11,_last_i);
          uVar15 = extraout_RDX_03;
        }
        else {
          bVar2 = true;
          (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,_last_i);
          uVar15 = extraout_RDX_02;
        }
        if ((mask.field_2._M_local_buf[0xf] & 1U) != 0) {
          io::Printer::Outdent(_last_i);
          io::Printer::Print(_last_i,"}\n");
          uVar15 = extraout_RDX_04;
        }
      }
      if ((local_169 & 1U) != 0) {
        if (bVar2) {
          local_331 = 0;
          if (i < 0) {
            internal::LogMessage::LogMessage
                      (&local_330,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc5d);
            local_331 = 1;
            pLVar13 = internal::LogMessage::operator<<
                                (&local_330,"CHECK failed: (0) <= (cached_has_bit_index): ");
            internal::LogFinisher::operator=(&local_332,pLVar13);
            iVar4 = extraout_EDX_00;
          }
          if ((local_331 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_330);
            iVar4 = extraout_EDX_01;
          }
          pPVar1 = _last_i;
          SimpleItoa_abi_cxx11_((string *)&j_1,(protobuf *)(ulong)(uint)i,iVar4);
          io::Printer::Print(pPVar1,"_has_bits_[$index$] |= cached_has_bits;\n","index",
                             (string *)&j_1);
          std::__cxx11::string::~string((string *)&j_1);
        }
        io::Printer::Outdent(_last_i);
        io::Printer::Print(_last_i,"}\n");
      }
    }
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
        "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
        "// @@protoc_insertion_point(generalized_merge_from_start:"
        "$full_name$)\n"
        "  GOOGLE_DCHECK_NE(&from, this);\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n"
      "        &from);\n"
      "if (source == NULL) {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_fail:"
      "$full_name$)\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_success:"
      "$full_name$)\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_, "full_name", descriptor_->full_name());

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  GOOGLE_DCHECK_NE(&from, this);\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  printer->Print(
    "_internal_metadata_.MergeFrom(from._internal_metadata_);\n"
    "::google::protobuf::uint32 cached_has_bits = 0;\n"
    "(void) cached_has_bits;\n\n");

  // cached_has_bit_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_bit_index]
  // for cached_has_bit_index >= 0
  int cached_has_bit_index = -1;

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Merge Repeated fields. These fields do not require a
    // check as we can simply iterate over them.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateMergingCode(printer);
    }

    // Merge Optional and Required fields (after a _has_bit_ check).
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        if (cached_has_bit_index != last_chunk / 4) {
          int new_index = last_chunk / 4;
          printer->Print("cached_has_bits = from._has_bits_[$new_index$];\n",
                         "new_index", SimpleItoa(new_index));
          cached_has_bit_index = new_index;
        }

        printer->Print(
          "if (cached_has_bits & $mask$u) {\n",
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit clears for each of the fields we processed.
      bool deferred_has_bit_changes = false;
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          // Attempt to use the state of cached_has_bits, if possible.
          int has_bit_index = has_bit_indices_[field->index()];
          if (!field->options().weak() &&
              cached_has_bit_index == has_bit_index / 32) {
            const string mask = StrCat(
                strings::Hex(1u << (has_bit_index % 32),
                strings::ZERO_PAD_8));

            printer->Print(
                "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
          } else {
            printer->Print(
              "if (from.has_$name$()) {\n",
              "name", FieldName(field));
          }

          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "from.", field);
        }

        if (have_outer_if && IsPOD(field)) {
          // GenerateCopyConstructorCode for enum and primitive scalar fields
          // does not do _has_bits_ modifications.  We defer _has_bits_
          // manipulation until the end of the outer if.
          //
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        if (deferred_has_bit_changes) {
          // Flush the has bits for the primitives we deferred.
          GOOGLE_CHECK_LE(0, cached_has_bit_index);
          printer->Print(
              "_has_bits_[$index$] |= cached_has_bits;\n",
              "index", SimpleItoa(cached_has_bit_index));
        }

        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }
  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}